

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmCommonTargetGenerator::GetLinkedTargetDirectories
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmCommonTargetGenerator *this,string *config)

{
  pointer pIVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  TargetType TVar5;
  int iVar6;
  cmComputeLinkInformation *this_00;
  ItemVector *pIVar7;
  cmLocalGenerator *this_01;
  string *psVar8;
  pointer pIVar9;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  cmGeneratorTarget *linkee;
  string di;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  emitted;
  cmGeneratorTarget *local_118;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_110;
  string local_108;
  string local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  undefined8 local_b8;
  undefined1 *puStack_b0;
  size_type local_a8;
  pointer local_a0;
  string *local_98;
  undefined8 local_90;
  undefined1 *puStack_88;
  undefined1 local_80 [32];
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  local_60;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98 = config;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  this_00 = cmGeneratorTarget::GetLinkInformation(this->GeneratorTarget,config);
  if (this_00 != (cmComputeLinkInformation *)0x0) {
    pIVar7 = cmComputeLinkInformation::GetItems(this_00);
    pIVar9 = (pIVar7->
             super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pIVar1 = (pIVar7->
             super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pIVar9 != pIVar1) {
      local_110 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  __return_storage_ptr__;
      do {
        local_118 = pIVar9->Target;
        if (local_118 != (cmGeneratorTarget *)0x0) {
          bVar4 = cmGeneratorTarget::IsImported(local_118);
          if (!bVar4) {
            TVar5 = cmGeneratorTarget::GetType(local_118);
            if (TVar5 != INTERFACE_LIBRARY) {
              pVar10 = std::
                       _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                       ::_M_insert_unique<cmGeneratorTarget_const*const&>
                                 ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                   *)&local_60,&local_118);
              if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                this_01 = cmGeneratorTarget::GetLocalGenerator(local_118);
                psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_01);
                pcVar2 = (psVar8->_M_dataplus)._M_p;
                sVar3 = psVar8->_M_string_length;
                local_90 = 1;
                puStack_88 = local_80;
                local_80[0] = 0x2f;
                (*this_01->_vptr_cmLocalGenerator[0xe])(&local_108,this_01,local_118);
                local_b8 = local_90;
                puStack_b0 = puStack_88;
                local_a8 = local_108._M_string_length;
                local_a0 = local_108._M_dataplus._M_p;
                views._M_len = 3;
                views._M_array = &local_c8;
                local_c8._M_len = sVar3;
                local_c8._M_str = pcVar2;
                cmCatViews_abi_cxx11_(&local_e8,views);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != &local_108.field_2) {
                  operator_delete(local_108._M_dataplus._M_p,
                                  local_108.field_2._M_allocated_capacity + 1);
                }
                __return_storage_ptr__ =
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_110;
                iVar6 = (*this_01->GlobalGenerator->_vptr_cmGlobalGenerator[0x26])();
                if ((char)iVar6 != '\0') {
                  local_90 = 1;
                  puStack_b0 = local_80;
                  local_80[0] = 0x2f;
                  local_c8._M_len = local_e8._M_string_length;
                  local_c8._M_str = local_e8._M_dataplus._M_p;
                  local_b8 = 1;
                  local_a0 = (local_98->_M_dataplus)._M_p;
                  local_a8 = local_98->_M_string_length;
                  views_00._M_len = 3;
                  views_00._M_array = &local_c8;
                  puStack_88 = puStack_b0;
                  cmCatViews_abi_cxx11_(&local_108,views_00);
                  std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_108);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_108._M_dataplus._M_p != &local_108.field_2) {
                    operator_delete(local_108._M_dataplus._M_p,
                                    local_108.field_2._M_allocated_capacity + 1);
                  }
                }
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           __return_storage_ptr__,&local_e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
              }
            }
          }
        }
        pIVar9 = pIVar9 + 1;
      } while (pIVar9 != pIVar1);
    }
  }
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~_Rb_tree(&local_60);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
            __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmCommonTargetGenerator::GetLinkedTargetDirectories(
  const std::string& config) const
{
  std::vector<std::string> dirs;
  std::set<cmGeneratorTarget const*> emitted;
  if (cmComputeLinkInformation* cli =
        this->GeneratorTarget->GetLinkInformation(config)) {
    cmComputeLinkInformation::ItemVector const& items = cli->GetItems();
    for (auto const& item : items) {
      cmGeneratorTarget const* linkee = item.Target;
      if (linkee &&
          !linkee->IsImported()
          // We can ignore the INTERFACE_LIBRARY items because
          // Target->GetLinkInformation already processed their
          // link interface and they don't have any output themselves.
          && linkee->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
          emitted.insert(linkee).second) {
        cmLocalGenerator* lg = linkee->GetLocalGenerator();
        std::string di = cmStrCat(lg->GetCurrentBinaryDirectory(), '/',
                                  lg->GetTargetDirectory(linkee));
        if (lg->GetGlobalGenerator()->IsMultiConfig()) {
          di = cmStrCat(di, '/', config);
        }
        dirs.push_back(std::move(di));
      }
    }
  }
  return dirs;
}